

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf_api.c
# Opt level: O0

void value_free_stack_doall(CONF_VALUE *a)

{
  stack_st_CONF_VALUE *sk_00;
  OPENSSL_STACK *pOVar1;
  void *ptr;
  undefined8 *in_RDI;
  int i;
  stack_st_CONF_VALUE *sk;
  CONF_VALUE *vv;
  int local_1c;
  
  if (in_RDI[1] == 0) {
    sk_00 = (stack_st_CONF_VALUE *)in_RDI[2];
    pOVar1 = ossl_check_const_CONF_VALUE_sk_type(sk_00);
    local_1c = OPENSSL_sk_num(pOVar1);
    while (local_1c = local_1c + -1, -1 < local_1c) {
      pOVar1 = ossl_check_const_CONF_VALUE_sk_type(sk_00);
      ptr = OPENSSL_sk_value(pOVar1,local_1c);
      CRYPTO_free(*(void **)((long)ptr + 0x10));
      CRYPTO_free(*(void **)((long)ptr + 8));
      CRYPTO_free(ptr);
    }
    ossl_check_CONF_VALUE_sk_type(sk_00);
    OPENSSL_sk_free((OPENSSL_STACK *)0x4c1afc);
    CRYPTO_free((void *)*in_RDI);
    CRYPTO_free(in_RDI);
  }
  return;
}

Assistant:

static void value_free_stack_doall(CONF_VALUE *a)
{
    CONF_VALUE *vv;
    STACK_OF(CONF_VALUE) *sk;
    int i;

    if (a->name != NULL)
        return;

    sk = (STACK_OF(CONF_VALUE) *)a->value;
    for (i = sk_CONF_VALUE_num(sk) - 1; i >= 0; i--) {
        vv = sk_CONF_VALUE_value(sk, i);
        OPENSSL_free(vv->value);
        OPENSSL_free(vv->name);
        OPENSSL_free(vv);
    }
    sk_CONF_VALUE_free(sk);
    OPENSSL_free(a->section);
    OPENSSL_free(a);
}